

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::CalculateHasBits(FieldGeneratorMap *this)

{
  int iVar1;
  uint uVar2;
  reference pvVar3;
  pointer pFVar4;
  int local_18;
  int extra_bits;
  int i;
  int total_bits;
  FieldGeneratorMap *this_local;
  
  extra_bits = 0;
  local_18 = 0;
  while( true ) {
    iVar1 = Descriptor::field_count(this->descriptor_);
    if (iVar1 <= local_18) break;
    pvVar3 = std::
             vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
             ::operator[](&this->field_generators_,(long)local_18);
    pFVar4 = std::
             unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
             ::operator->(pvVar3);
    uVar2 = (*pFVar4->_vptr_FieldGenerator[9])();
    if ((uVar2 & 1) == 0) {
      pvVar3 = std::
               vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
               ::operator[](&this->field_generators_,(long)local_18);
      pFVar4 = std::
               unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
               ::operator->(pvVar3);
      FieldGenerator::SetNoHasBit(pFVar4);
    }
    else {
      pvVar3 = std::
               vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
               ::operator[](&this->field_generators_,(long)local_18);
      pFVar4 = std::
               unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
               ::operator->(pvVar3);
      FieldGenerator::SetRuntimeHasBit(pFVar4,extra_bits);
      extra_bits = extra_bits + 1;
    }
    pvVar3 = std::
             vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
             ::operator[](&this->field_generators_,(long)local_18);
    pFVar4 = std::
             unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
             ::operator->(pvVar3);
    iVar1 = (*pFVar4->_vptr_FieldGenerator[10])();
    if (iVar1 != 0) {
      pvVar3 = std::
               vector<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>_>_>
               ::operator[](&this->field_generators_,(long)local_18);
      pFVar4 = std::
               unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
               ::operator->(pvVar3);
      (*pFVar4->_vptr_FieldGenerator[0xb])(pFVar4,(ulong)(uint)extra_bits);
      extra_bits = iVar1 + extra_bits;
    }
    local_18 = local_18 + 1;
  }
  return extra_bits;
}

Assistant:

int FieldGeneratorMap::CalculateHasBits(void) {
  int total_bits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (field_generators_[i]->RuntimeUsesHasBit()) {
      field_generators_[i]->SetRuntimeHasBit(total_bits);
      ++total_bits;
    } else {
      field_generators_[i]->SetNoHasBit();
    }
    int extra_bits = field_generators_[i]->ExtraRuntimeHasBitsNeeded();
    if (extra_bits) {
      field_generators_[i]->SetExtraRuntimeHasBitsBase(total_bits);
      total_bits += extra_bits;
    }
  }
  return total_bits;
}